

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O3

SampledSpectrum __thiscall pbrt::PointLight::Phi(PointLight *this,SampledWavelengths *lambda)

{
  float fVar1;
  float fVar2;
  float fVar5;
  undefined1 auVar6 [56];
  undefined1 in_ZMM1 [64];
  undefined1 auVar8 [56];
  SampledSpectrum SVar9;
  undefined1 auVar4 [64];
  undefined1 auVar3 [16];
  undefined1 auVar7 [64];
  
  auVar8 = in_ZMM1._8_56_;
  fVar1 = this->scale;
  auVar6 = (undefined1  [56])0x0;
  SVar9 = DenselySampledSpectrum::Sample(&this->I,lambda);
  auVar7._0_8_ = SVar9.values.values._8_8_;
  auVar7._8_56_ = auVar8;
  auVar4._0_8_ = SVar9.values.values._0_8_;
  auVar4._8_56_ = auVar6;
  auVar3 = vmovlhps_avx(auVar4._0_16_,auVar7._0_16_);
  fVar1 = fVar1 * 12.566371;
  fVar2 = fVar1 * auVar3._0_4_;
  fVar5 = fVar1 * auVar3._4_4_;
  auVar3 = CONCAT412(fVar1 * auVar3._12_4_,CONCAT48(fVar1 * auVar3._8_4_,CONCAT44(fVar5,fVar2)));
  auVar3 = vshufpd_avx(auVar3,auVar3,1);
  SVar9.values.values._8_8_ = auVar3._0_8_;
  SVar9.values.values[0] = fVar2;
  SVar9.values.values[1] = fVar5;
  return (SampledSpectrum)SVar9.values.values;
}

Assistant:

SampledSpectrum PointLight::Phi(const SampledWavelengths &lambda) const {
    return 4 * Pi * scale * I.Sample(lambda);
}